

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_symbols.cxx
# Opt level: O0

void draw_filesaveas(Fl_Color c)

{
  Fl_Color FVar1;
  Fl_Color c_local;
  
  draw_filesave(c);
  FVar1 = fl_color_average(c,0xff,0.25);
  fl_color(FVar1);
  fl_begin_polygon();
  fl_vertex(0.6,-0.8);
  fl_vertex(1.0,-0.4);
  fl_vertex(0.0,0.6);
  fl_vertex(-0.4,0.6);
  fl_vertex(-0.4,0.2);
  fl_end_polygon();
  FVar1 = fl_darker(c);
  fl_color(FVar1);
  fl_begin_loop();
  fl_vertex(0.6,-0.8);
  fl_vertex(1.0,-0.4);
  fl_vertex(0.0,0.6);
  fl_vertex(-0.4,0.6);
  fl_vertex(-0.4,0.2);
  fl_end_loop();
  fl_begin_polygon();
  fl_vertex(-0.1,0.6);
  fl_vertex(-0.4,0.6);
  fl_vertex(-0.4,0.3);
  fl_end_polygon();
  return;
}

Assistant:

static void draw_filesaveas(Fl_Color c) {
  draw_filesave(c);

  fl_color(fl_color_average(c, FL_WHITE, 0.25f));
  BP;
    vv(0.6, -0.8);
    vv(1.0, -0.4);
    vv(0.0, 0.6);
    vv(-0.4, 0.6);
    vv(-0.4, 0.2);
  EP;

  fl_color(fl_darker(c));
  BC;
    vv(0.6, -0.8);
    vv(1.0, -0.4);
    vv(0.0, 0.6);
    vv(-0.4, 0.6);
    vv(-0.4, 0.2);
  EC;

  BP;
    vv(-0.1, 0.6);
    vv(-0.4, 0.6);
    vv(-0.4, 0.3);
  EP;
}